

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OSTime.c
# Opt level: O0

char * strtime_fns(void)

{
  tm *__tp;
  size_t sVar1;
  tm *timeptr;
  time_t t;
  
  memset(strftime_fns_tmpbuf,0,0x40);
  time((time_t *)&timeptr);
  __tp = localtime((time_t *)&timeptr);
  if ((__tp != (tm *)0x0) &&
     (sVar1 = strftime(strftime_fns_tmpbuf,0x40,"%Y-%m-%d_%Hh%Mmin%Ss",__tp), sVar1 == 0)) {
    memset(strftime_fns_tmpbuf,0,0x40);
  }
  return strftime_fns_tmpbuf;
}

Assistant:

char* strtime_fns(void)	
{
#ifndef WINCE
	time_t t;
	struct tm *timeptr = NULL;

	memset(strftime_fns_tmpbuf, 0, sizeof(strftime_fns_tmpbuf));

	time(&t);
	timeptr = localtime(&t);

	if (timeptr == NULL)
	{
		return strftime_fns_tmpbuf;
	}

	// Use strftime to build a customized time string. 
	if (strftime(
		strftime_fns_tmpbuf,
		sizeof(strftime_fns_tmpbuf),
		"%Y-%m-%d_%Hh%Mmin%Ss",
		timeptr
		) <= 0)
	{
		memset(strftime_fns_tmpbuf, 0, sizeof(strftime_fns_tmpbuf));
		return strftime_fns_tmpbuf;
	}
#else
	int nb = 0;
	TCHAR* tstr = (TCHAR*)calloc(sizeof(strftime_fns_tmpbuf), sizeof(TCHAR));

	memset(strftime_fns_tmpbuf, 0, sizeof(strftime_fns_tmpbuf));

	if (tstr == NULL)
	{
		return strftime_fns_tmpbuf;
	}

	memset(tstr, 0, sizeof(strftime_fns_tmpbuf)*sizeof(TCHAR));

	// Use GetDateFormat() and GetTimeFormat() to build a customized time string. 
	nb = GetDateFormat(
		MAKELCID(MAKELANGID(LANG_ENGLISH, SUBLANG_ENGLISH_US), SORT_DEFAULT), // Locale.
		0, // Flags.
		NULL, // Current local system date.
		_T("yyyy'-'MM'-'dd'_'"), // Format the string. 
		tstr, 
		sizeof(strftime_fns_tmpbuf)
		);
	if (nb <= 0)
	{
		free(tstr); tstr = NULL;
		return strftime_fns_tmpbuf;
	}

	if (GetTimeFormat(
		MAKELCID(MAKELANGID(LANG_ENGLISH, SUBLANG_ENGLISH_US), SORT_DEFAULT), // Locale.
		0, // Flags.
		NULL, // Current local system time.
		_T("HH'h'mm'min'ss's'"), // Format the string. 
		tstr+(nb-1), 
		sizeof(strftime_fns_tmpbuf)-(nb-1)
		) <= 0)
	{
		free(tstr); tstr = NULL;
		return strftime_fns_tmpbuf;
	}

#ifdef UNICODE
	wcstombs(strftime_fns_tmpbuf, tstr, sizeof(strftime_fns_tmpbuf));
#else
	memcpy(strftime_fns_tmpbuf, tstr, sizeof(strftime_fns_tmpbuf));
#endif // UNICODE
	strftime_fns_tmpbuf[sizeof(strftime_fns_tmpbuf)-1] = 0;
	free(tstr); tstr = NULL;
#endif // !WINCE

	return strftime_fns_tmpbuf;
}